

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write<char,std::back_insert_iterator<std::__cxx11::string>>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,char *value)

{
  char *pcVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar2;
  format_error *this;
  size_t in_RCX;
  basic_string_view<char> value_00;
  
  if (value != (char *)0x0) {
    pcVar1 = (char *)strlen(value);
    value_00.size_ = in_RCX;
    value_00.data_ = pcVar1;
    bVar2 = write<char,std::back_insert_iterator<std::__cxx11::string>>
                      (out.container,
                       (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )value,value_00);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar2.container;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this,"string pointer is null");
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

OutputIt write(OutputIt out, const Char* value) {
  if (!value) {
    FMT_THROW(format_error("string pointer is null"));
  } else {
    auto length = std::char_traits<Char>::length(value);
    out = write(out, basic_string_view<Char>(value, length));
  }
  return out;
}